

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

void crypto::xchacha20::run_rounds(word *keystream)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  word wVar7;
  uint uVar8;
  uint uVar9;
  word wVar10;
  uint uVar11;
  word wVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  word wVar16;
  uint uVar17;
  word wVar18;
  uint uVar19;
  uint uVar20;
  word wVar21;
  uint uVar22;
  word wVar23;
  bool bVar24;
  word local_54;
  word local_50;
  uint local_4c;
  uint local_48;
  
  wVar16 = keystream[4];
  wVar23 = *keystream;
  local_48 = keystream[1];
  uVar2 = keystream[0xc];
  uVar1 = keystream[8];
  wVar18 = keystream[5];
  wVar21 = keystream[0xd];
  uVar5 = keystream[9];
  uVar4 = keystream[6];
  wVar10 = keystream[2];
  wVar12 = keystream[0xe];
  local_54 = keystream[10];
  wVar7 = keystream[7];
  local_4c = keystream[3];
  uVar3 = keystream[0xf];
  local_50 = keystream[0xb];
  lVar6 = 10;
  while (bVar24 = lVar6 != 0, lVar6 = lVar6 + -1, bVar24) {
    uVar2 = uVar2 ^ wVar23 + wVar16;
    uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
    uVar1 = uVar1 + uVar2;
    uVar14 = wVar16 ^ uVar1;
    uVar14 = uVar14 << 0xc | uVar14 >> 0x14;
    uVar22 = wVar23 + wVar16 + uVar14;
    uVar2 = uVar2 ^ uVar22;
    uVar2 = uVar2 << 8 | uVar2 >> 0x18;
    uVar1 = uVar1 + uVar2;
    uVar14 = uVar14 ^ uVar1;
    uVar15 = uVar14 << 7 | uVar14 >> 0x19;
    uVar14 = wVar21 ^ local_48 + wVar18;
    uVar19 = uVar14 << 0x10 | uVar14 >> 0x10;
    uVar5 = uVar5 + uVar19;
    uVar14 = wVar18 ^ uVar5;
    uVar14 = uVar14 << 0xc | uVar14 >> 0x14;
    local_48 = local_48 + wVar18 + uVar14;
    uVar19 = uVar19 ^ local_48;
    uVar20 = uVar19 << 8 | uVar19 >> 0x18;
    uVar5 = uVar5 + uVar20;
    uVar14 = uVar14 ^ uVar5;
    uVar17 = uVar14 << 7 | uVar14 >> 0x19;
    uVar14 = wVar12 ^ wVar10 + uVar4;
    uVar19 = uVar14 << 0x10 | uVar14 >> 0x10;
    uVar13 = local_54 + uVar19;
    uVar14 = uVar4 ^ uVar13;
    uVar14 = uVar14 << 0xc | uVar14 >> 0x14;
    uVar8 = wVar10 + uVar4 + uVar14;
    uVar19 = uVar19 ^ uVar8;
    uVar11 = uVar19 << 8 | uVar19 >> 0x18;
    uVar13 = uVar13 + uVar11;
    uVar14 = uVar14 ^ uVar13;
    uVar14 = uVar14 << 7 | uVar14 >> 0x19;
    uVar3 = uVar3 ^ local_4c + wVar7;
    uVar4 = uVar3 << 0x10 | uVar3 >> 0x10;
    uVar9 = local_50 + uVar4;
    uVar3 = wVar7 ^ uVar9;
    uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
    local_4c = local_4c + wVar7 + uVar3;
    uVar4 = uVar4 ^ local_4c;
    uVar4 = uVar4 << 8 | uVar4 >> 0x18;
    uVar9 = uVar9 + uVar4;
    uVar3 = uVar3 ^ uVar9;
    uVar19 = uVar3 << 7 | uVar3 >> 0x19;
    uVar22 = uVar22 + uVar17;
    uVar4 = uVar4 ^ uVar22;
    uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
    uVar13 = uVar13 + uVar4;
    uVar17 = uVar17 ^ uVar13;
    uVar17 = uVar17 << 0xc | uVar17 >> 0x14;
    wVar23 = uVar22 + uVar17;
    uVar4 = uVar4 ^ wVar23;
    uVar3 = uVar4 << 8 | uVar4 >> 0x18;
    local_54 = uVar13 + uVar3;
    uVar17 = uVar17 ^ local_54;
    wVar18 = uVar17 << 7 | uVar17 >> 0x19;
    local_48 = local_48 + uVar14;
    uVar2 = uVar2 ^ local_48;
    uVar2 = uVar2 << 0x10 | uVar2 >> 0x10;
    uVar9 = uVar9 + uVar2;
    uVar14 = uVar14 ^ uVar9;
    uVar4 = uVar14 << 0xc | uVar14 >> 0x14;
    local_48 = local_48 + uVar4;
    uVar2 = uVar2 ^ local_48;
    uVar2 = uVar2 << 8 | uVar2 >> 0x18;
    local_50 = uVar9 + uVar2;
    uVar4 = uVar4 ^ local_50;
    uVar4 = uVar4 << 7 | uVar4 >> 0x19;
    uVar8 = uVar8 + uVar19;
    uVar20 = uVar20 ^ uVar8;
    uVar9 = uVar20 << 0x10 | uVar20 >> 0x10;
    uVar1 = uVar1 + uVar9;
    uVar19 = uVar19 ^ uVar1;
    uVar14 = uVar19 << 0xc | uVar19 >> 0x14;
    wVar10 = uVar8 + uVar14;
    uVar9 = uVar9 ^ wVar10;
    wVar21 = uVar9 << 8 | uVar9 >> 0x18;
    uVar1 = uVar1 + wVar21;
    uVar14 = uVar14 ^ uVar1;
    wVar7 = uVar14 << 7 | uVar14 >> 0x19;
    local_4c = local_4c + uVar15;
    uVar11 = uVar11 ^ local_4c;
    uVar14 = uVar11 << 0x10 | uVar11 >> 0x10;
    uVar5 = uVar5 + uVar14;
    uVar15 = uVar15 ^ uVar5;
    uVar19 = uVar15 << 0xc | uVar15 >> 0x14;
    local_4c = local_4c + uVar19;
    uVar14 = uVar14 ^ local_4c;
    wVar12 = uVar14 << 8 | uVar14 >> 0x18;
    uVar5 = uVar5 + wVar12;
    uVar19 = uVar19 ^ uVar5;
    wVar16 = uVar19 << 7 | uVar19 >> 0x19;
  }
  keystream[4] = wVar16;
  *keystream = wVar23;
  keystream[0xc] = uVar2;
  keystream[8] = uVar1;
  keystream[5] = wVar18;
  keystream[1] = local_48;
  keystream[0xd] = wVar21;
  keystream[9] = uVar5;
  keystream[6] = uVar4;
  keystream[2] = wVar10;
  keystream[0xe] = wVar12;
  keystream[10] = local_54;
  keystream[7] = wVar7;
  keystream[3] = local_4c;
  keystream[0xf] = uVar3;
  keystream[0xb] = local_50;
  return;
}

Assistant:

void xchacha20::run_rounds(word keystream[16]) {
	
	#define CHACHA20_QR(a, b, c, d) \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 16); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 12); \
		a += b; \
		d = d ^ a; \
		d = util::rotl_fixed(d, 8); \
		c += d; \
		b = b ^ c; \
		b = util::rotl_fixed(b, 7);
	
	for(size_t i = 0; i < 10; i++) {
		CHACHA20_QR(keystream[0], keystream[4], keystream[8], keystream[12]);  // column 0
		CHACHA20_QR(keystream[1], keystream[5], keystream[9], keystream[13]);  // column 1
		CHACHA20_QR(keystream[2], keystream[6], keystream[10], keystream[14]); // column 2
		CHACHA20_QR(keystream[3], keystream[7], keystream[11], keystream[15]); // column 3
		CHACHA20_QR(keystream[0], keystream[5], keystream[10], keystream[15]); // diagonal 1 (main diagonal)
		CHACHA20_QR(keystream[1], keystream[6], keystream[11], keystream[12]); // diagonal 2
		CHACHA20_QR(keystream[2], keystream[7], keystream[8], keystream[13]);  // diagonal 3
		CHACHA20_QR(keystream[3], keystream[4], keystream[9], keystream[14]);  // diagonal 4
	}
	
	#undef CHACHA20_QR
	
}